

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_bounding_box.cpp
# Opt level: O1

bool __thiscall
ON_ClippingRegionPoints::AppendClipPoint
          (ON_ClippingRegionPoints *this,ON_3dPoint clip_point,uint clip_flag)

{
  uint uVar1;
  ON_3dPoint *pOVar2;
  bool bVar3;
  ulong uVar4;
  ulong buffer_point_capacity;
  
  uVar1 = this->m_point_count;
  if (this->m_point_capacity <= uVar1) {
    uVar4 = 0x20;
    if (this->m_buffer_point_capacity != 0) {
      uVar4 = this->m_buffer_point_capacity * 2;
    }
    buffer_point_capacity = (ulong)(uVar1 + 0x20);
    if (uVar1 <= uVar4) {
      buffer_point_capacity = uVar4;
    }
    bVar3 = ReserveBufferPointCapacity(this,buffer_point_capacity);
    if (!bVar3) {
      return false;
    }
  }
  pOVar2 = this->m_clip_points;
  uVar1 = this->m_point_count;
  pOVar2[uVar1].z = clip_point.z;
  pOVar2 = pOVar2 + uVar1;
  pOVar2->x = clip_point.x;
  pOVar2->y = clip_point.y;
  this->m_clip_flags[this->m_point_count] = clip_flag;
  if (this->m_point_count == 0) {
    this->m_and_clip_flags = clip_flag;
    this->m_or_clip_flags = clip_flag;
  }
  else {
    this->m_and_clip_flags = this->m_and_clip_flags & clip_flag;
    this->m_or_clip_flags = this->m_or_clip_flags | clip_flag;
  }
  this->m_point_count = this->m_point_count + 1;
  return true;
}

Assistant:

bool ON_ClippingRegionPoints::AppendClipPoint(
  ON_3dPoint clip_point,
  unsigned int clip_flag
  )
{
  if (m_point_count >= m_point_capacity)
  {
    size_t buffer_point_capacity = (0 == m_buffer_point_capacity) ? 32 : 2*m_buffer_point_capacity;
    if ( buffer_point_capacity < m_point_count )
      buffer_point_capacity = m_point_count+32;

    if (false == ReserveBufferPointCapacity(buffer_point_capacity))
      return false;
  }

  m_clip_points[m_point_count] = clip_point;
  m_clip_flags[m_point_count] = clip_flag;
  if (0 == m_point_count)
  {
    m_and_clip_flags = clip_flag;
    m_or_clip_flags = clip_flag;
  }
  else
  {
    m_and_clip_flags &= clip_flag;
    m_or_clip_flags |= clip_flag;
  }

  m_point_count++;

  return true;
}